

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O2

void __thiscall
glslang::TSmallArrayVector::push_back(TSmallArrayVector *this,TSmallArrayVector *newDims)

{
  alloc(this);
  std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>::
  insert<__gnu_cxx::__normal_iterator<glslang::TArraySize*,std::vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>>>,void>
            ((vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)this->sizes
             ,*(TArraySize **)
               ((vector<glslang::TArraySize,glslang::pool_allocator<glslang::TArraySize>> *)
                this->sizes + 0x10),
             (newDims->sizes->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (newDims->sizes->
             super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>).
             super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void push_back(const TSmallArrayVector& newDims)
    {
        alloc();
        sizes->insert(sizes->end(), newDims.sizes->begin(), newDims.sizes->end());
    }